

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

void png_read_filter_row_paeth_multibyte_pixel
               (png_row_infop row_info,png_bytep row,png_const_bytep prev_row)

{
  byte bVar1;
  png_size_t pVar2;
  ulong uVar3;
  long lVar4;
  png_bytep ppVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  
  uVar3 = (ulong)(row_info->pixel_depth + 7 >> 3);
  for (ppVar5 = row; ppVar5 < row + uVar3; ppVar5 = ppVar5 + 1) {
    bVar1 = *prev_row;
    prev_row = prev_row + 1;
    *ppVar5 = *ppVar5 + bVar1;
  }
  pVar2 = row_info->rowbytes;
  lVar4 = -uVar3;
  for (; ppVar5 < row + pVar2; ppVar5 = ppVar5 + 1) {
    bVar1 = prev_row[lVar4];
    bVar8 = *prev_row;
    prev_row = prev_row + 1;
    uVar9 = (uint)bVar8 - (uint)bVar1;
    uVar6 = (uint)ppVar5[lVar4] - (uint)bVar1;
    uVar7 = -uVar9;
    if (0 < (int)uVar9) {
      uVar7 = uVar9;
    }
    uVar10 = -uVar6;
    if (0 < (int)uVar6) {
      uVar10 = uVar6;
    }
    uVar10 = uVar10 & 0xff;
    uVar6 = uVar6 + uVar9;
    uVar9 = -uVar6;
    if (0 < (int)uVar6) {
      uVar9 = uVar6;
    }
    if ((uVar7 & 0xff) <= uVar10) {
      uVar10 = uVar7 & 0xff;
      bVar8 = ppVar5[lVar4];
    }
    if (uVar9 < uVar10) {
      bVar8 = bVar1;
    }
    *ppVar5 = *ppVar5 + bVar8;
  }
  return;
}

Assistant:

static void
png_read_filter_row_paeth_multibyte_pixel(png_row_infop row_info, png_bytep row,
    png_const_bytep prev_row)
{
   unsigned int bpp = (row_info->pixel_depth + 7) >> 3;
   png_bytep rp_end = row + bpp;

   /* Process the first pixel in the row completely (this is the same as 'up'
    * because there is only one candidate predictor for the first row).
    */
   while (row < rp_end)
   {
      int a = *row + *prev_row++;
      *row++ = (png_byte)a;
   }

   /* Remainder */
   rp_end = rp_end + (row_info->rowbytes - bpp);

   while (row < rp_end)
   {
      int a, b, c, pa, pb, pc, p;

      c = *(prev_row - bpp);
      a = *(row - bpp);
      b = *prev_row++;

      p = b - c;
      pc = a - c;

#ifdef PNG_USE_ABS
      pa = abs(p);
      pb = abs(pc);
      pc = abs(p + pc);
#else
      pa = p < 0 ? -p : p;
      pb = pc < 0 ? -pc : pc;
      pc = (p + pc) < 0 ? -(p + pc) : p + pc;
#endif

      if (pb < pa)
      {
         pa = pb; a = b;
      }
      if (pc < pa) a = c;

      a += *row;
      *row++ = (png_byte)a;
   }
}